

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

bool __thiscall amrex::Box::coarsenable(Box *this,IntVect *refrat,IntVect *min_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  IntVect IVar13;
  Box local_48;
  int local_2c [3];
  
  IVar13 = size(this);
  iVar1 = refrat->vect[0];
  if (IVar13.vect[0] < min_width->vect[0] * iVar1) {
    return false;
  }
  iVar2 = refrat->vect[1];
  if (IVar13.vect[1] < min_width->vect[1] * iVar2) {
    return false;
  }
  iVar3 = refrat->vect[2];
  if (IVar13.vect[2] < min_width->vect[2] * iVar3) {
    return false;
  }
  lVar10 = *(long *)(this->smallend).vect;
  lVar4 = *(long *)((this->smallend).vect + 2);
  lVar5 = *(long *)(this->bigend).vect;
  uVar6 = *(ulong *)((this->bigend).vect + 2);
  local_48.bigend.vect[1] = (int)((ulong)lVar5 >> 0x20);
  local_48.bigend.vect[2] = (int)uVar6;
  local_48.btype.itype = (int)(uVar6 >> 0x20);
  local_48.smallend.vect[2] = (int)lVar4;
  local_48.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
  local_48.smallend.vect[1] = (int)((ulong)lVar10 >> 0x20);
  uVar9 = local_48.smallend.vect[1];
  if (iVar2 == 1 && iVar1 == 1) {
    local_48.smallend.vect._0_8_ = lVar10;
    if (iVar3 == 1) goto LAB_0030ad01;
  }
  else {
    local_48.smallend.vect[0] = (int)lVar10;
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if (local_48.smallend.vect[0] < 0) {
          local_48.smallend.vect[0] = local_48.smallend.vect[0] >> 2;
        }
        else {
          local_48.smallend.vect[0] = (uint)local_48.smallend.vect[0] >> 2;
        }
      }
      else if (iVar1 == 2) {
        if (local_48.smallend.vect[0] < 0) {
          local_48.smallend.vect[0] = local_48.smallend.vect[0] >> 1;
        }
        else {
          local_48.smallend.vect[0] = (uint)local_48.smallend.vect[0] >> 1;
        }
      }
      else if (local_48.smallend.vect[0] < 0) {
        local_48.smallend.vect[0] = ~(~local_48.smallend.vect[0] / iVar1);
      }
      else {
        local_48.smallend.vect[0] = local_48.smallend.vect[0] / iVar1;
      }
    }
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if (lVar10 < 0) {
          uVar9 = local_48.smallend.vect[1] >> 2;
        }
        else {
          uVar9 = (uint)local_48.smallend.vect[1] >> 2;
        }
      }
      else if (iVar2 == 2) {
        if (lVar10 < 0) {
          uVar9 = local_48.smallend.vect[1] >> 1;
        }
        else {
          uVar9 = (uint)local_48.smallend.vect[1] >> 1;
        }
      }
      else if (lVar10 < 0) {
        uVar9 = ~(~local_48.smallend.vect[1] / iVar2);
      }
      else {
        uVar9 = local_48.smallend.vect[1] / iVar2;
      }
    }
  }
  local_48.smallend.vect[1] = uVar9;
  if (iVar3 != 1) {
    if (iVar3 == 4) {
      if (local_48.smallend.vect[2] < 0) {
        local_48.smallend.vect[2] = local_48.smallend.vect[2] >> 2;
      }
      else {
        local_48.smallend.vect[2] = (uint)local_48.smallend.vect[2] >> 2;
      }
    }
    else if (iVar3 == 2) {
      if (local_48.smallend.vect[2] < 0) {
        local_48.smallend.vect[2] = local_48.smallend.vect[2] >> 1;
      }
      else {
        local_48.smallend.vect[2] = (uint)local_48.smallend.vect[2] >> 1;
      }
    }
    else if (local_48.smallend.vect[2] < 0) {
      local_48.smallend.vect[2] = ~(~local_48.smallend.vect[2] / iVar3);
    }
    else {
      local_48.smallend.vect[2] = local_48.smallend.vect[2] / iVar3;
    }
  }
  local_48.btype.itype = (uint)(uVar6 >> 0x20);
  local_48.bigend.vect[2] = (int)uVar6;
  if (local_48.btype.itype == 0) {
    uVar12 = local_48.bigend.vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        uVar12 = local_48.bigend.vect[0] >> 2;
        if (-1 < lVar4) {
          uVar12 = (uint)local_48.bigend.vect[0] >> 2;
        }
      }
      else if (iVar1 == 2) {
        uVar12 = local_48.bigend.vect[0] >> 1;
        if (-1 < lVar4) {
          uVar12 = (uint)local_48.bigend.vect[0] >> 1;
        }
      }
      else if (lVar4 < 0) {
        uVar12 = ~(~local_48.bigend.vect[0] / iVar1);
      }
      else {
        uVar12 = local_48.bigend.vect[0] / iVar1;
      }
    }
    uVar11 = local_48.bigend.vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        uVar11 = local_48.bigend.vect[1] >> 2;
        if (-1 < lVar5) {
          uVar11 = (uint)local_48.bigend.vect[1] >> 2;
        }
      }
      else if (iVar2 == 2) {
        uVar11 = local_48.bigend.vect[1] >> 1;
        if (-1 < lVar5) {
          uVar11 = (uint)local_48.bigend.vect[1] >> 1;
        }
      }
      else if (lVar5 < 0) {
        uVar11 = ~(~local_48.bigend.vect[1] / iVar2);
      }
      else {
        uVar11 = local_48.bigend.vect[1] / iVar2;
      }
    }
    uVar8 = local_48.bigend.vect[2];
    local_48.bigend.vect[0] = uVar12;
    local_48.bigend.vect[1] = uVar11;
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        uVar8 = local_48.bigend.vect[2] >> 2;
        if (-1 < local_48.bigend.vect[2]) {
          uVar8 = (uint)local_48.bigend.vect[2] >> 2;
        }
      }
      else if (iVar3 == 2) {
        uVar8 = local_48.bigend.vect[2] >> 1;
        if (-1 < local_48.bigend.vect[2]) {
          uVar8 = (uint)local_48.bigend.vect[2] >> 1;
        }
      }
      else if (local_48.bigend.vect[2] < 0) {
        uVar8 = ~(~local_48.bigend.vect[2] / iVar3);
      }
      else {
        uVar8 = local_48.bigend.vect[2] / iVar3;
      }
    }
  }
  else {
    local_2c[0] = 0;
    local_2c[1] = 0;
    local_2c[2] = 0;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      if (((local_48.btype.itype >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
         (local_48.bigend.vect[lVar10] % refrat->vect[lVar10] != 0)) {
        local_2c[lVar10] = 1;
      }
    }
    uVar12 = local_48.bigend.vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        uVar12 = local_48.bigend.vect[0] >> 2;
        if (-1 < lVar4) {
          uVar12 = (uint)local_48.bigend.vect[0] >> 2;
        }
      }
      else if (iVar1 == 2) {
        uVar12 = local_48.bigend.vect[0] >> 1;
        if (-1 < lVar4) {
          uVar12 = (uint)local_48.bigend.vect[0] >> 1;
        }
      }
      else if (lVar4 < 0) {
        uVar12 = ~(~local_48.bigend.vect[0] / iVar1);
      }
      else {
        uVar12 = local_48.bigend.vect[0] / iVar1;
      }
    }
    uVar11 = local_48.bigend.vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        uVar11 = local_48.bigend.vect[1] >> 2;
        if (-1 < lVar5) {
          uVar11 = (uint)local_48.bigend.vect[1] >> 2;
        }
      }
      else if (iVar2 == 2) {
        uVar11 = local_48.bigend.vect[1] >> 1;
        if (-1 < lVar5) {
          uVar11 = (uint)local_48.bigend.vect[1] >> 1;
        }
      }
      else if (lVar5 < 0) {
        uVar11 = ~(~local_48.bigend.vect[1] / iVar2);
      }
      else {
        uVar11 = local_48.bigend.vect[1] / iVar2;
      }
    }
    uVar8 = local_48.bigend.vect[2];
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        uVar8 = local_48.bigend.vect[2] >> 2;
        if (-1 < local_48.bigend.vect[2]) {
          uVar8 = (uint)local_48.bigend.vect[2] >> 2;
        }
      }
      else if (iVar3 == 2) {
        uVar8 = local_48.bigend.vect[2] >> 1;
        if (-1 < local_48.bigend.vect[2]) {
          uVar8 = (uint)local_48.bigend.vect[2] >> 1;
        }
      }
      else if (local_48.bigend.vect[2] < 0) {
        uVar8 = ~(~local_48.bigend.vect[2] / iVar3);
      }
      else {
        uVar8 = local_48.bigend.vect[2] / iVar3;
      }
    }
    uVar8 = uVar8 + local_2c[2];
    local_48.bigend.vect[0] = uVar12 + local_2c[0];
    local_48.bigend.vect[1] = uVar11 + local_2c[1];
  }
  local_48.bigend.vect[2] = uVar8;
  if ((iVar2 != 1 || iVar1 != 1) || iVar3 != 1) {
    local_48.smallend.vect[1] = uVar9 * iVar2;
    local_48.smallend.vect[0] = local_48.smallend.vect[0] * iVar1;
    local_48.smallend.vect[2] = local_48.smallend.vect[2] * iVar3;
    uVar9 = (uint)((uVar6 & 0x200000000) == 0);
    uVar12 = (uint)((uVar6 & 0x400000000) == 0);
    local_48.bigend.vect[0] =
         (local_48.bigend.vect[0] + (~local_48.btype.itype & 1)) * iVar1 -
         (~local_48.btype.itype & 1);
    local_48.bigend.vect[1] = (local_48.bigend.vect[1] + uVar9) * iVar2 - uVar9;
    local_48.bigend.vect[2] = (uVar8 + uVar12) * iVar3 - uVar12;
  }
LAB_0030ad01:
  bVar7 = operator==(this,&local_48);
  return bVar7;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool coarsenable(const IntVect& refrat, const IntVect& min_width) const noexcept
    {
        if (!size().allGE(refrat*min_width)) {
            return false;
        } else {
            Box testBox = *this;
            testBox.coarsen(refrat);
            testBox.refine (refrat);
            return (*this == testBox);
        }
    }